

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackableobject.h
# Opt level: O0

void __thiscall
Trackableobject::Trackableobject(Trackableobject *this,int _objectID,centroid c,rect *r)

{
  int in_ESI;
  pair<centroid,_rect> *in_RDI;
  value_type *in_stack_ffffffffffffff78;
  queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
  *in_stack_ffffffffffffff80;
  pair<centroid,_rect> *this_00;
  pair<float,_float> local_4c [7];
  int local_14;
  int local_8;
  int iStack_4;
  
  local_14 = in_ESI;
  std::
  queue<std::pair<centroid,rect>,std::deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>>>
  ::queue<std::deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>>,void>
            (in_stack_ffffffffffffff80);
  std::
  queue<std::pair<float,float>,std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>>
  ::queue<std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>,void>
            ((queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
              *)in_stack_ffffffffffffff80);
  std::
  queue<std::pair<float,float>,std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>>
  ::queue<std::deque<std::pair<float,float>,std::allocator<std::pair<float,float>>>,void>
            ((queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
              *)in_stack_ffffffffffffff80);
  rect::rect((rect *)(in_RDI + 10));
  std::pair<float,_float>::pair<float,_float,_true>((pair<float,_float> *)&in_RDI[10].second.x2);
  std::pair<float,_float>::pair<float,_float,_true>((pair<float,_float> *)(in_RDI + 0xb));
  in_RDI[0xb].second.y1 = local_14;
  in_RDI[0xb].second.x1 = 100;
  this_00 = in_RDI;
  std::pair<centroid,_rect>::pair<centroid_&,_rect_&,_true>
            (in_RDI,&in_stack_ffffffffffffff78->first,(rect *)0x1298b4);
  std::
  queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
  ::push((queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
          *)this_00,in_stack_ffffffffffffff78);
  std::pair<float,_float>::pair<int_&,_int_&,_true>(local_4c,&local_8,&iStack_4);
  std::pair<float,_float>::operator=((pair<float,_float> *)&in_RDI[10].second.x2,local_4c);
  return;
}

Assistant:

Trackableobject(int _objectID, centroid c, rect r) {
		this->objectID = _objectID;
		maxRemenbers = 100;
		this->locations.push(std::pair<centroid, rect>(c, r));

		lastlocation = std::pair<float, float>(c.x, c.y);
	}